

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GoogleNamerTest.cpp
# Opt level: O3

void __thiscall
TestCaseNameDifferentNameThanFile_TestName_Test::TestBody
          (TestCaseNameDifferentNameThanFile_TestName_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  ApprovalTestNamer namer;
  AssertHelper AStack_48;
  internal local_40 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  string local_30;
  ApprovalTestNamer local_10;
  
  local_10.super_ApprovalNamer._vptr_ApprovalNamer = (ApprovalNamer)&PTR__ApprovalNamer_0017eb80;
  ApprovalTests::ApprovalTestNamer::getTestName_abi_cxx11_(&local_30,&local_10);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[43]>
            (local_40,"namer.getTestName()","\"TestCaseNameDifferentNameThanFile.TestName\"",
             &local_30,(char (*) [43])"TestCaseNameDifferentNameThanFile.TestName");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  if (local_40[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_38.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_38.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/tests/GoogleTest_Tests/namers/GoogleNamerTest.cpp"
               ,0x13,message);
    testing::internal::AssertHelper::operator=(&AStack_48,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_48);
    if ((long *)local_30._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_30._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_30._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(GoogleNamerTest, TestSuffixMatcherBug)
{
    std::string testCaseName = "ApprovalTestsTest";
    std::string suffix = "Test";
    std::string fileName = "/a/b/c/testApprovalTests.cpp";
    auto converter = GoogleConfiguration::createIgnorableTestCaseNameSuffixCheck(suffix);
    EXPECT_EQ(converter(fileName, testCaseName), true);
}